

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_fixed.cc
# Opt level: O2

string * __thiscall
absl::lts_20250127::time_internal::cctz::FixedOffsetToName_abi_cxx11_
          (string *__return_storage_ptr__,cctz *this,seconds *offset)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  char cVar4;
  short sVar5;
  char cVar6;
  int iVar7;
  int iVar8;
  allocator<char> *__a;
  char *__s;
  allocator<char> local_29;
  char buf [19];
  
  uVar1 = *(ulong *)this;
  if ((uVar1 == 0) || (uVar1 - 0x15181 < 0xfffffffffffd5cff)) {
    __s = "UTC";
    __a = (allocator<char> *)buf;
  }
  else {
    uVar2 = (ulong)(uint)((int)uVar1 >> 0x1f) << 0x20 | uVar1 & 0xffffffff;
    sVar5 = (short)((long)uVar2 / 0x3c);
    lVar3 = (long)uVar2 % 0x3c;
    cVar6 = (char)lVar3;
    iVar7 = (int)lVar3;
    buf[9] = ((byte)(uVar1 >> 0x1f) & 1) * '\x02' + '+';
    if ((int)uVar1 < 0) {
      iVar8 = iVar7 + -0x3c;
      if (iVar7 < 1) {
        iVar8 = iVar7;
      }
      sVar5 = -((ushort)(0 < iVar7) + sVar5);
      cVar6 = -(char)iVar8;
    }
    __s = buf;
    builtin_strncpy(buf,"Fixed/UTC",9);
    cVar4 = (char)(sVar5 / 0x3c);
    buf[10] = (anonymous_namespace)::kDigits[cVar4 / '\n'];
    buf[0xb] = (anonymous_namespace)::kDigits[(int)(cVar4 % '\n')];
    buf[0xc] = ':';
    cVar4 = (char)(sVar5 % 0x3c);
    buf[0xd] = (anonymous_namespace)::kDigits[cVar4 / '\n'];
    buf[0xe] = (anonymous_namespace)::kDigits[(int)(cVar4 % '\n')];
    buf[0xf] = ':';
    buf[0x10] = (anonymous_namespace)::kDigits[cVar6 / '\n'];
    buf[0x11] = (anonymous_namespace)::kDigits[(int)(cVar6 % '\n')];
    buf[0x12] = '\0';
    __a = &local_29;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  return __return_storage_ptr__;
}

Assistant:

std::string FixedOffsetToName(const seconds& offset) {
  if (offset == seconds::zero()) return "UTC";
  if (offset < std::chrono::hours(-24) || offset > std::chrono::hours(24)) {
    // We don't support fixed-offset zones more than 24 hours
    // away from UTC to avoid complications in rendering such
    // offsets and to (somewhat) limit the total number of zones.
    return "UTC";
  }
  int offset_seconds = static_cast<int>(offset.count());
  const char sign = (offset_seconds < 0 ? '-' : '+');
  int offset_minutes = offset_seconds / 60;
  offset_seconds %= 60;
  if (sign == '-') {
    if (offset_seconds > 0) {
      offset_seconds -= 60;
      offset_minutes += 1;
    }
    offset_seconds = -offset_seconds;
    offset_minutes = -offset_minutes;
  }
  int offset_hours = offset_minutes / 60;
  offset_minutes %= 60;
  const std::size_t prefix_len = sizeof(kFixedZonePrefix) - 1;
  char buf[prefix_len + sizeof("-24:00:00")];
  char* ep = std::copy_n(kFixedZonePrefix, prefix_len, buf);
  *ep++ = sign;
  ep = Format02d(ep, offset_hours);
  *ep++ = ':';
  ep = Format02d(ep, offset_minutes);
  *ep++ = ':';
  ep = Format02d(ep, offset_seconds);
  *ep++ = '\0';
  assert(ep == buf + sizeof(buf));
  return buf;
}